

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O0

void __thiscall Centaurus::ATNMachine<wchar_t>::parse(ATNMachine<wchar_t> *this,Stream *stream)

{
  wchar_t wVar1;
  StreamException *pSVar2;
  wchar_t ch;
  Stream *stream_local;
  ATNMachine<wchar_t> *this_local;
  
  wVar1 = Stream::skip_whitespace(stream);
  if (wVar1 != L':') {
    pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(pSVar2,stream,wVar1);
    __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
  }
  Stream::discard(stream);
  std::vector<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>::
  emplace_back<>(&this->m_nodes);
  parse_selection(this,stream);
  wVar1 = Stream::skip_whitespace(stream);
  if (wVar1 != L';') {
    pSVar2 = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(pSVar2,stream,wVar1);
    __cxa_throw(pSVar2,&StreamException::typeinfo,StreamException::~StreamException);
  }
  Stream::discard(stream);
  return;
}

Assistant:

void ATNMachine<TCHAR>::parse(Stream& stream)
{
	wchar_t ch = stream.skip_whitespace();
	
	if (ch != L':')
		throw stream.unexpected(ch);
	stream.discard();

	m_nodes.emplace_back();
	parse_selection(stream);

	ch = stream.skip_whitespace();
	
	if (ch != L';')
		throw stream.unexpected(ch);
	stream.discard();
}